

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::convertRGBModel
               (uchar *out,uchar *in,uint w,uint h,LodePNGState *state_out,LodePNGState *state_in,
               uint rendering_intent)

{
  uint uVar1;
  LodePNGState *in_R8;
  LodePNGState *in_R9;
  float whitepoint [3];
  float *xyz;
  uint error;
  uint in_stack_00000098;
  uint in_stack_0000009c;
  LodePNGColorMode *in_stack_000000a0;
  LodePNGColorMode *in_stack_000000a8;
  uchar *in_stack_000000b0;
  uchar *in_stack_000000b8;
  LodePNGState *in_stack_00000160;
  uint in_stack_00000168;
  uint in_stack_0000016c;
  uchar *in_stack_00000170;
  float *in_stack_00000178;
  float *in_stack_00000180;
  float *in_stack_000001b0;
  LodePNGState *in_stack_000001b8;
  uint in_stack_000001c0;
  uint in_stack_000001c4;
  float *in_stack_000001c8;
  uchar *in_stack_000001d0;
  uint in_stack_000001e0;
  undefined4 local_34;
  undefined4 local_4;
  
  uVar1 = modelsEqual(in_R8,in_R9);
  if (uVar1 == 0) {
    lodepng_malloc(0x1427d3);
    local_34 = convertToXYZ(in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_0000016c,
                            in_stack_00000168,in_stack_00000160);
    if (local_34 == 0) {
      local_34 = convertFromXYZ(in_stack_000001d0,in_stack_000001c8,in_stack_000001c4,
                                in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,
                                in_stack_000001e0);
    }
    lodepng_free((void *)0x14283b);
    local_4 = local_34;
  }
  else {
    local_4 = lodepng_convert(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                              in_stack_000000a0,in_stack_0000009c,in_stack_00000098);
  }
  return local_4;
}

Assistant:

unsigned convertRGBModel(unsigned char* out, const unsigned char* in,
                         unsigned w, unsigned h,
                         const LodePNGState* state_out,
                         const LodePNGState* state_in,
                         unsigned rendering_intent) {
  if(modelsEqual(state_in, state_out)) {
    return lodepng_convert(out, in, &state_out->info_raw, &state_in->info_raw, w, h);
  } else {
    unsigned error = 0;
    float* xyz = (float*)lodepng_malloc(w * h * 4 * sizeof(float));
    float whitepoint[3];
    error = convertToXYZ(&xyz[0], whitepoint, in, w, h, state_in);
    if (!error) error = convertFromXYZ(out, &xyz[0], w, h, state_out, whitepoint, rendering_intent);
    lodepng_free(xyz);
    return error;
  }
}